

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O1

int elf_zlib_inflate_and_verify
              (uchar *pin,size_t sin,uint16_t *zdebug_table,uchar *pout,size_t sout)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *__s;
  uchar uVar3;
  ushort uVar4;
  uint *puVar5;
  ulong uVar6;
  uchar *codes;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  int iVar10;
  ulong codes_len;
  ulong codes_len_00;
  byte *pbVar11;
  uint uVar12;
  uint uVar13;
  uchar *puVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint16_t *in_R10;
  int iVar19;
  uchar *__s_00;
  uint uVar20;
  uint unaff_R14D;
  uint16_t *unaff_R15;
  bool bVar21;
  int local_a0;
  undefined8 uStack_88;
  uchar codebits [19];
  ulong local_38;
  
  puVar14 = pin + sin;
  puVar1 = pout + sout;
  __s_00 = pout;
  do {
    if ((long)puVar14 - (long)pin < 5) {
      if (__s_00 == puVar1) {
        elf_zlib_inflate_and_verify_cold_1();
        return (int)uStack_88;
      }
      return 0;
    }
    bVar7 = (byte)*(uint *)pin;
    if ((((char)bVar7 < '\0') || ((bVar7 & 0xf) != 8)) || ((*(byte *)((long)pin + 1) & 0x20) != 0))
    {
      uVar20 = 0;
    }
    else {
      uVar20 = 0;
      if ((uint)CONCAT11(bVar7,*(byte *)((long)pin + 1)) * -0x42108421 < 0x8421085) {
        puVar5 = (uint *)((long)pin + 2);
        if (((ulong)puVar5 & 3) == 0) {
          local_38 = 0;
        }
        else {
          uVar20 = 0;
          local_38 = 0;
          pbVar11 = (byte *)((long)pin + 3);
          do {
            local_38 = local_38 | (ulong)(byte)*puVar5 << ((byte)uVar20 & 0x3f);
            uVar20 = uVar20 + 8;
            puVar5 = (uint *)((long)puVar5 + 1);
            uVar6 = (ulong)pbVar11 & 3;
            pbVar11 = pbVar11 + 1;
          } while (uVar6 != 0);
        }
        uVar18 = 0;
        pin = (uchar *)puVar5;
        do {
          if (uVar20 < 0xf) {
            if (3 < (long)puVar14 - (long)pin) {
              local_38 = local_38 | (ulong)*(uint *)pin << ((byte)uVar20 & 0x3f);
              uVar20 = uVar20 | 0x20;
              pin = (uchar *)((long)pin + 4);
              goto LAB_0012c96a;
            }
            bVar21 = true;
          }
          else {
LAB_0012c96a:
            bVar21 = false;
          }
          iVar17 = 1;
          if (bVar21) goto LAB_0012d1e7;
          uVar18 = (uint)local_38 & 1;
          uVar6 = local_38 >> 1;
          local_38 = local_38 >> 3;
          uVar12 = uVar20 - 3;
          iVar10 = (int)puVar1;
          switch((uint)uVar6 & 3) {
          case 0:
            if (7 < uVar12) {
              pin = (uchar *)(~(ulong)(uVar20 - 0xb >> 3) + (long)pin);
            }
            if ((long)puVar14 - (long)pin < 4) {
              local_38 = 0;
              uVar20 = 0;
            }
            else {
              uVar4 = (ushort)*(uint *)pin;
              puVar5 = (uint *)((long)pin + 4);
              if ((((*(ushort *)((long)pin + 2) ^ uVar4) == 0xffff) &&
                  ((uint)uVar4 <= (uint)((int)puVar14 - (int)puVar5))) &&
                 ((uint)uVar4 <= (uint)(iVar10 - (int)__s_00))) {
                uVar6 = (ulong)uVar4;
                memcpy(__s_00,puVar5,uVar6);
                __s_00 = __s_00 + uVar6;
                puVar5 = (uint *)((long)puVar5 + uVar6);
                iVar17 = 6;
                if (((ulong)puVar5 & 3) == 0) {
                  local_38 = 0;
                  uVar20 = 0;
                  pin = (uchar *)puVar5;
                }
                else {
                  uVar20 = 0;
                  local_38 = 0;
                  pbVar11 = (byte *)((long)pin + uVar6 + 5);
                  pin = (uchar *)puVar5;
                  do {
                    local_38 = local_38 | (ulong)(byte)*(uint *)pin << ((byte)uVar20 & 0x3f);
                    uVar20 = uVar20 + 8;
                    pin = (uchar *)((long)pin + 1);
                    uVar6 = (ulong)pbVar11 & 3;
                    pbVar11 = pbVar11 + 1;
                  } while (uVar6 != 0);
                }
              }
              else {
                uVar20 = 0;
                local_38 = 0;
                pin = (uchar *)puVar5;
              }
            }
            break;
          case 1:
            unaff_R15 = elf_zlib_default_dist_table;
            in_R10 = elf_zlib_default_table;
            goto LAB_0012cd99;
          case 2:
            if (uVar12 < 0xf) {
              if (3 < (long)puVar14 - (long)pin) {
                local_38 = local_38 | (ulong)*(uint *)pin << ((byte)uVar12 & 0x3f);
                uVar12 = uVar12 | 0x20;
                pin = (uchar *)((long)pin + 4);
                goto LAB_0012cac6;
              }
              bVar21 = true;
            }
            else {
LAB_0012cac6:
              bVar21 = false;
            }
            if (bVar21) {
              bVar21 = false;
            }
            else {
              uVar20 = (uint)local_38 & 0x1f;
              uVar6 = local_38 >> 0xe;
              uVar12 = uVar12 - 0xe;
              if ((uVar20 < 0x1e) && (uVar13 = (uint)(local_38 >> 5) & 0x1f, uVar13 < 0x1e)) {
                uStack_88 = 0;
                codebits[0] = '\0';
                codebits[1] = '\0';
                codebits[2] = '\0';
                codebits[3] = '\0';
                codebits[4] = '\0';
                codebits[5] = '\0';
                codebits[6] = '\0';
                codebits[7] = '\0';
                codebits[8] = '\0';
                codebits[9] = '\0';
                codebits[10] = '\0';
                if (uVar12 < 0xf) {
                  if (3 < (long)puVar14 - (long)pin) {
                    uVar6 = uVar6 | (ulong)*(uint *)pin << ((byte)uVar12 & 0x3f);
                    uVar12 = uVar12 | 0x20;
                    pin = (uchar *)((long)pin + 4);
                    goto LAB_0012cb74;
                  }
                  bVar21 = true;
                }
                else {
LAB_0012cb74:
                  bVar21 = false;
                }
                if (!bVar21) {
                  uVar16 = (uint)(local_38 >> 10) & 0xf;
                  codebits[8] = (byte)uVar6 & 7;
                  codebits[9] = (byte)((uVar6 & 0xffffffff) >> 3) & 7;
                  codebits[10] = (byte)(uVar6 >> 6) & 7;
                  uStack_88 = uVar6 >> 9 & 7;
                  if ((local_38 >> 10 & 0xf) == 0) {
                    uVar12 = uVar12 - 0xc;
                    local_38 = uVar6 >> 0xc;
                  }
                  else {
                    codebits[0] = (byte)(uVar6 >> 0xc) & 7;
                    uVar6 = uVar6 >> 0xf;
                    uVar12 = uVar12 - 0xf;
                    local_38 = uVar6;
                    if (uVar16 != 1) {
                      if (uVar12 < 0xf) {
                        if (3 < (long)puVar14 - (long)pin) {
                          uVar6 = uVar6 | (ulong)*(uint *)pin << ((byte)uVar12 & 0x3f);
                          uVar12 = uVar12 | 0x20;
                          pin = (uchar *)((long)pin + 4);
                          goto LAB_0012cc17;
                        }
                        bVar21 = true;
                      }
                      else {
LAB_0012cc17:
                        bVar21 = false;
                      }
                      if (bVar21) goto LAB_0012cd86;
                      uStack_88 = CONCAT17((char)uVar6,(undefined7)uStack_88) & 0x7ffffffffffffff;
                      local_38 = uVar6 >> 3;
                      if (uVar16 == 2) {
LAB_0012d236:
                        uVar12 = uVar12 - 3;
                      }
                      else {
                        codebits[1] = (byte)local_38 & 7;
                        local_38 = uVar6 >> 6;
                        if (uVar16 == 3) {
LAB_0012d24e:
                          uVar12 = uVar12 - 6;
                        }
                        else {
                          uStack_88 = CONCAT17(uStack_88._7_1_,
                                               CONCAT16((char)local_38,(undefined6)uStack_88)) &
                                      0xff07ffffffffffff;
                          local_38 = uVar6 >> 9;
                          if (uVar16 != 4) {
                            codebits[2] = (byte)local_38 & 7;
                            local_38 = uVar6 >> 0xc;
                            if (uVar16 == 5) {
LAB_0012d267:
                              uVar12 = uVar12 - 0xc;
                              goto LAB_0012d279;
                            }
                            uStack_88 = CONCAT26(uStack_88._6_2_,
                                                 CONCAT15((char)local_38,(undefined5)uStack_88)) &
                                        0xffff07ffffffffff;
                            uVar6 = uVar6 >> 0xf;
                            uVar12 = uVar12 - 0xf;
                            local_38 = uVar6;
                            if (uVar16 == 6) goto LAB_0012d279;
                            if (uVar12 < 0xf) {
                              if (3 < (long)puVar14 - (long)pin) {
                                uVar6 = uVar6 | (ulong)*(uint *)pin << ((byte)uVar12 & 0x3f);
                                uVar12 = uVar12 | 0x20;
                                pin = (uchar *)((long)pin + 4);
                                goto LAB_0012ccc2;
                              }
                              bVar21 = true;
                            }
                            else {
LAB_0012ccc2:
                              bVar21 = false;
                            }
                            if (bVar21) goto LAB_0012cd86;
                            codebits[3] = (byte)uVar6 & 7;
                            local_38 = uVar6 >> 3;
                            if (uVar16 == 7) goto LAB_0012d236;
                            uStack_88 = CONCAT35(uStack_88._5_3_,
                                                 CONCAT14((char)local_38,(int)uStack_88)) &
                                        0xffffff07ffffffff;
                            local_38 = uVar6 >> 6;
                            if (uVar16 == 8) goto LAB_0012d24e;
                            codebits[4] = (byte)local_38 & 7;
                            local_38 = uVar6 >> 9;
                            if (uVar16 == 9) goto LAB_0012d262;
                            uStack_88 = CONCAT44(uStack_88._4_4_,
                                                 CONCAT13((char)local_38,(undefined3)uStack_88)) &
                                        0xffffffff07ffffff;
                            local_38 = uVar6 >> 0xc;
                            if (uVar16 == 10) goto LAB_0012d267;
                            codebits[5] = (byte)local_38 & 7;
                            uVar6 = uVar6 >> 0xf;
                            uVar12 = uVar12 - 0xf;
                            local_38 = uVar6;
                            if (uVar16 == 0xb) goto LAB_0012d279;
                            if (uVar12 < 0xf) {
                              if (3 < (long)puVar14 - (long)pin) {
                                uVar6 = uVar6 | (ulong)*(uint *)pin << ((byte)uVar12 & 0x3f);
                                uVar12 = uVar12 | 0x20;
                                pin = (uchar *)((long)pin + 4);
                                goto LAB_0012cd6d;
                              }
                              bVar21 = true;
                            }
                            else {
LAB_0012cd6d:
                              bVar21 = false;
                            }
                            if (bVar21) goto LAB_0012cd86;
                            uStack_88 = CONCAT53(uStack_88._3_5_,
                                                 CONCAT12((char)uVar6,(undefined2)uStack_88)) &
                                        0xffffffffff07ffff;
                            local_38 = uVar6 >> 3;
                            if (uVar16 == 0xc) goto LAB_0012d236;
                            codebits[6] = (byte)local_38 & 7;
                            local_38 = uVar6 >> 6;
                            if (uVar16 == 0xd) goto LAB_0012d24e;
                            uStack_88 = CONCAT62(uStack_88._2_6_,
                                                 CONCAT11((char)local_38,(uchar)uStack_88)) &
                                        0xffffffffffff07ff;
                            local_38 = uVar6 >> 9;
                            if (uVar16 != 0xe) {
                              codebits[7] = (byte)local_38 & 7;
                              uVar12 = uVar12 - 0xc;
                              local_38 = uVar6 >> 0xc;
                              goto LAB_0012d279;
                            }
                          }
LAB_0012d262:
                          uVar12 = uVar12 - 9;
                        }
                      }
                    }
                  }
LAB_0012d279:
                  iVar17 = elf_zlib_inflate_table
                                     ((uchar *)&uStack_88,0x13,zdebug_table,zdebug_table);
                  if (iVar17 == 0) {
                    bVar21 = false;
                    goto LAB_0012cd8a;
                  }
                  codes_len = (ulong)(uVar20 + 0x101);
                  codes = (uchar *)((long)(zdebug_table + 0x93c) + codes_len);
                  codes_len_00 = (ulong)(uVar13 + 1);
                  puVar2 = codes + codes_len_00;
                  lVar15 = 0x1278;
                  do {
                    __s = (uchar *)((long)zdebug_table + lVar15);
                    if (puVar2 <= __s) {
                      uVar6 = local_38;
                      if ((char)zdebug_table[0x9bc] != '\0') {
                        iVar17 = elf_zlib_inflate_table
                                           ((uchar *)(zdebug_table + 0x93c),codes_len,zdebug_table,
                                            zdebug_table);
                        if (iVar17 == 0) {
                          bVar21 = false;
                        }
                        else {
                          iVar17 = elf_zlib_inflate_table
                                             (codes,codes_len_00,zdebug_table,zdebug_table + 0x400);
                          bVar21 = iVar17 != 0;
                          if (bVar21) {
                            in_R10 = zdebug_table;
                            unaff_R15 = zdebug_table + 0x400;
                          }
                        }
                        goto LAB_0012cd8a;
                      }
                      break;
                    }
                    if (uVar12 < 0xf) {
                      if (3 < (long)puVar14 - (long)pin) {
                        local_38 = local_38 | (ulong)*(uint *)pin << ((byte)uVar12 & 0x3f);
                        uVar12 = uVar12 | 0x20;
                        pin = (uchar *)((long)pin + 4);
                        goto LAB_0012d321;
                      }
                      bVar21 = true;
                    }
                    else {
LAB_0012d321:
                      bVar21 = false;
                    }
                    if ((bVar21) || (uVar4 = zdebug_table[local_38 & 0xff], (uVar4 >> 0xc & 1) != 0)
                       ) {
LAB_0012d327:
                      bVar21 = false;
                    }
                    else {
                      iVar17 = (uVar4 >> 9 & 7) + 1;
                      local_38 = local_38 >> (sbyte)iVar17;
                      uVar12 = uVar12 - iVar17;
                      uVar9 = uVar4 & 0x1ff;
                      if (uVar9 < 0x10) {
                        lVar15 = lVar15 + 1;
                        *__s = (uchar)uVar4;
                      }
                      else {
                        iVar19 = (int)puVar2;
                        iVar17 = (int)__s;
                        uVar20 = (uint)local_38;
                        if (uVar9 == 0x12) {
                          uVar20 = (uVar20 & 0x7f) + 0xb;
                          if (uVar20 <= (uint)(iVar19 - iVar17)) {
                            memset(__s,0,(ulong)uVar20);
                            lVar15 = lVar15 + (ulong)uVar20;
                          }
                          local_38 = local_38 >> 7;
                          uVar12 = uVar12 - 7;
                          if (uVar20 <= (uint)(iVar19 - iVar17)) goto LAB_0012d364;
                          bVar21 = false;
                          goto LAB_0012d366;
                        }
                        if (uVar9 != 0x11) {
                          if (uVar9 != 0x10) goto LAB_0012d327;
                          if (lVar15 == 0x1278) {
LAB_0012d556:
                            bVar21 = false;
                          }
                          else {
                            local_38 = local_38 >> 2;
                            uVar12 = uVar12 - 2;
                            if ((uint)(iVar19 - iVar17) < (uVar20 & 3) + 3) goto LAB_0012d556;
                            uVar3 = __s[-1];
                            switch(uVar20 & 3) {
                            case 0:
                              goto LAB_0012d4b0;
                            case 1:
                              break;
                            case 3:
                              lVar15 = lVar15 + 1;
                              *__s = uVar3;
                            case 2:
                              *(uchar *)((long)zdebug_table + lVar15) = uVar3;
                              lVar15 = lVar15 + 1;
                            }
                            *(uchar *)((long)zdebug_table + lVar15) = uVar3;
                            lVar15 = lVar15 + 1;
LAB_0012d4b0:
                            *(uchar *)((long)zdebug_table + lVar15) = uVar3;
                            *(uchar *)((long)zdebug_table + lVar15 + 1) = uVar3;
                            *(uchar *)((long)zdebug_table + lVar15 + 2) = uVar3;
                            lVar15 = lVar15 + 3;
                            bVar21 = true;
                          }
                          if (!bVar21) goto LAB_0012d327;
                          goto LAB_0012d364;
                        }
                        uVar13 = (uVar20 & 7) + 3;
                        if (uVar13 <= (uint)(iVar19 - iVar17)) {
                          switch(uVar20 & 7) {
                          case 0:
                            goto LAB_0012d529;
                          case 1:
                            goto LAB_0012d521;
                          case 2:
                            goto LAB_0012d519;
                          case 3:
                            goto LAB_0012d511;
                          case 4:
                            goto LAB_0012d509;
                          case 5:
                            break;
                          case 7:
                            lVar15 = lVar15 + 1;
                            *__s = '\0';
                          case 6:
                            *(undefined1 *)((long)zdebug_table + lVar15) = 0;
                            lVar15 = lVar15 + 1;
                          }
                          *(undefined1 *)((long)zdebug_table + lVar15) = 0;
                          lVar15 = lVar15 + 1;
LAB_0012d509:
                          *(undefined1 *)((long)zdebug_table + lVar15) = 0;
                          lVar15 = lVar15 + 1;
LAB_0012d511:
                          *(undefined1 *)((long)zdebug_table + lVar15) = 0;
                          lVar15 = lVar15 + 1;
LAB_0012d519:
                          *(undefined1 *)((long)zdebug_table + lVar15) = 0;
                          lVar15 = lVar15 + 1;
LAB_0012d521:
                          *(undefined1 *)((long)zdebug_table + lVar15) = 0;
                          lVar15 = lVar15 + 1;
LAB_0012d529:
                          *(undefined2 *)((long)zdebug_table + lVar15) = 0;
                          *(undefined1 *)((long)zdebug_table + lVar15 + 2) = 0;
                          lVar15 = lVar15 + 3;
                        }
                        local_38 = local_38 >> 3;
                        uVar12 = uVar12 - 3;
                        if ((uint)(iVar19 - iVar17) < uVar13) goto LAB_0012d327;
                      }
LAB_0012d364:
                      bVar21 = true;
                    }
LAB_0012d366:
                    uVar6 = local_38;
                  } while (bVar21);
                }
              }
LAB_0012cd86:
              local_38 = uVar6;
              bVar21 = false;
            }
LAB_0012cd8a:
            if (!bVar21) goto switchD_0012c9a6_caseD_3;
LAB_0012cd99:
            do {
              if (uVar12 < 0xf) {
                if (3 < (long)puVar14 - (long)pin) {
                  local_38 = local_38 | (ulong)*(uint *)pin << ((byte)uVar12 & 0x3f);
                  uVar12 = uVar12 | 0x20;
                  pin = (uchar *)((long)pin + 4);
                  goto LAB_0012cdc9;
                }
                bVar21 = true;
                uVar20 = uVar12;
              }
              else {
LAB_0012cdc9:
                bVar21 = false;
                uVar20 = uVar12;
              }
              iVar17 = 1;
              if (!bVar21) {
                uVar4 = in_R10[local_38 & 0xff];
                uVar12 = uVar4 >> 9 & 7;
                uVar13 = uVar4 & 0x1ff;
                uVar6 = (ulong)uVar13;
                if ((uVar4 >> 0xc & 1) == 0) {
                  uVar12 = uVar12 + 1;
                }
                else {
                  uVar13 = in_R10[uVar6 + ((uint)(local_38 >> 8) & ~(-1 << (sbyte)uVar12)) + 0x100]
                           & 0x1ff;
                  uVar12 = in_R10[uVar6 + ((uint)(local_38 >> 8) & ~(-1 << (sbyte)uVar12)) + 0x100]
                           >> 9 & 7 | 8;
                }
                uVar20 = uVar20 - uVar12;
                local_38 = local_38 >> (sbyte)uVar12;
                if (uVar13 < 0x100) {
                  if (__s_00 == puVar1) goto LAB_0012cf63;
                  *__s_00 = (uchar)uVar13;
                  __s_00 = __s_00 + 1;
LAB_0012ce4f:
                  iVar17 = 0;
                }
                else {
                  if (uVar13 == 0x100) {
                    iVar17 = 0x12;
                    goto LAB_0012cf63;
                  }
                  if (uVar13 < 0x109) {
                    unaff_R14D = uVar13 - 0xfe;
                  }
                  else if (uVar13 == 0x11d) {
                    unaff_R14D = 0x102;
                  }
                  else {
                    if (0x11d < uVar13) goto LAB_0012cf63;
                    if (uVar20 < 0xf) {
                      if (3 < (long)puVar14 - (long)pin) {
                        local_38 = local_38 | (ulong)*(uint *)pin << ((byte)uVar20 & 0x3f);
                        uVar20 = uVar20 | 0x20;
                        pin = (uchar *)((long)pin + 4);
                        goto LAB_0012cec7;
                      }
                      bVar21 = true;
                    }
                    else {
LAB_0012cec7:
                      bVar21 = false;
                    }
                    if (!bVar21) {
                      uVar12 = uVar13 - 0x109 >> 2;
                      iVar17 = uVar12 + 1;
                      bVar7 = (byte)iVar17;
                      bVar8 = (byte)uVar12;
                      unaff_R14D = ((uint)local_38 & (2 << (bVar8 & 0x1f)) - 1U) +
                                   ((uVar13 - 0x109 & 3) << (bVar7 & 0x1f)) +
                                   ~(-1 << (bVar8 & 0x1f)) * 8 + 0xb;
                      local_38 = local_38 >> (bVar7 & 0x3f);
                      uVar20 = uVar20 - iVar17;
                    }
                    iVar17 = 1;
                    if (bVar21) goto LAB_0012cf63;
                  }
                  iVar17 = 1;
                  if (uVar20 < 0xf) {
                    if (3 < (long)puVar14 - (long)pin) {
                      local_38 = local_38 | (ulong)*(uint *)pin << ((byte)uVar20 & 0x3f);
                      uVar20 = uVar20 | 0x20;
                      pin = (uchar *)((long)pin + 4);
                      goto LAB_0012cf5d;
                    }
                    bVar21 = true;
                  }
                  else {
LAB_0012cf5d:
                    bVar21 = false;
                  }
                  if (!bVar21) {
                    uVar4 = unaff_R15[local_38 & 0xff];
                    uVar12 = uVar4 >> 9 & 7;
                    uVar13 = uVar4 & 0x1ff;
                    uVar6 = (ulong)uVar13;
                    if ((uVar4 >> 0xc & 1) == 0) {
                      uVar12 = uVar12 + 1;
                    }
                    else {
                      uVar13 = unaff_R15[uVar6 + ((uint)(local_38 >> 8) & ~(-1 << (sbyte)uVar12)) +
                                         0x100] & 0x1ff;
                      uVar12 = unaff_R15[uVar6 + ((uint)(local_38 >> 8) & ~(-1 << (sbyte)uVar12)) +
                                         0x100] >> 9 & 7 | 8;
                    }
                    uVar20 = uVar20 - uVar12;
                    local_38 = local_38 >> (sbyte)uVar12;
                    iVar19 = (int)__s_00;
                    if (uVar13 == 0) {
                      if ((__s_00 != pout) && (unaff_R14D <= (uint)(iVar10 - iVar19))) {
                        memset(__s_00,(uint)__s_00[-1],(ulong)unaff_R14D);
                        __s_00 = __s_00 + unaff_R14D;
                        goto LAB_0012ce4f;
                      }
                    }
                    else {
                      if (uVar13 < 0x1e) {
                        if (uVar13 < 4) {
                          uVar13 = uVar13 + 1;
                        }
                        else {
                          if (uVar20 < 0xf) {
                            if (3 < (long)puVar14 - (long)pin) {
                              local_38 = local_38 | (ulong)*(uint *)pin << ((byte)uVar20 & 0x3f);
                              uVar20 = uVar20 | 0x20;
                              pin = (uchar *)((long)pin + 4);
                              goto LAB_0012d08e;
                            }
                            bVar21 = true;
                          }
                          else {
LAB_0012d08e:
                            bVar21 = false;
                          }
                          if (bVar21) goto LAB_0012d0e1;
                          uVar12 = uVar13 - 4 >> 1;
                          iVar17 = uVar12 + 1;
                          bVar7 = (byte)iVar17;
                          bVar8 = (byte)uVar12;
                          uVar13 = ((uint)local_38 & (2 << (bVar8 & 0x1f)) - 1U) +
                                   ((uVar13 & 1) << (bVar7 & 0x1f)) + ~(-1 << (bVar8 & 0x1f)) * 4 +
                                   5;
                          local_38 = local_38 >> (bVar7 & 0x3f);
                          uVar20 = uVar20 - iVar17;
                        }
                        local_a0 = (int)pout;
                        if ((uVar13 <= (uint)(iVar19 - local_a0)) &&
                           (unaff_R14D <= (uint)(iVar10 - iVar19))) {
                          lVar15 = -(ulong)uVar13;
                          if (uVar13 < unaff_R14D) {
                            do {
                              uVar6 = (ulong)uVar13;
                              if (unaff_R14D < uVar13) {
                                uVar6 = (ulong)unaff_R14D;
                              }
                              memcpy(__s_00,__s_00 + lVar15,uVar6);
                              __s_00 = __s_00 + uVar6;
                              iVar17 = 0;
                              unaff_R14D = unaff_R14D - (int)uVar6;
                            } while (unaff_R14D != 0);
                            unaff_R14D = 0;
                          }
                          else {
                            memcpy(__s_00,__s_00 + lVar15,(ulong)unaff_R14D);
                            __s_00 = __s_00 + unaff_R14D;
                            iVar17 = 0;
                          }
                          goto LAB_0012cf63;
                        }
                      }
LAB_0012d0e1:
                      iVar17 = 1;
                    }
                  }
                }
              }
LAB_0012cf63:
              uVar12 = uVar20;
            } while (iVar17 == 0);
            if (iVar17 == 0x12) {
              iVar17 = 0;
            }
            break;
          case 3:
switchD_0012c9a6_caseD_3:
            iVar17 = 1;
            uVar20 = uVar12;
          }
LAB_0012d1e7:
          if ((iVar17 != 6) && (iVar17 != 0)) goto LAB_0012d6c1;
        } while (uVar18 == 0);
        iVar17 = 0;
LAB_0012d6c1:
        uVar20 = (uint)(iVar17 == 0);
      }
    }
    if ((char)uVar20 == '\0') {
      return 0;
    }
  } while( true );
}

Assistant:

static int
elf_zlib_inflate_and_verify (const unsigned char *pin, size_t sin,
			     uint16_t *zdebug_table, unsigned char *pout,
			     size_t sout)
{
  if (!elf_zlib_inflate (pin, sin, zdebug_table, pout, sout))
    return 0;
  if (!elf_zlib_verify_checksum (pin + sin - 4, pout, sout))
    return 0;
  return 1;
}